

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_narrow.c
# Opt level: O2

TRef lj_opt_narrow_convert(jit_State *J)

{
  IRType *pIVar1;
  undefined4 uVar2;
  NarrowIns *pNVar3;
  short sVar4;
  int iVar5;
  uint uVar6;
  IRType IVar7;
  TRef TVar8;
  IRRef1 IVar9;
  NarrowIns *pNVar10;
  NarrowIns *pNVar11;
  IRType *pIVar12;
  undefined1 auVar13 [16];
  uint local_470;
  NarrowConv local_450;
  
  TVar8 = 0;
  if ((J->flags & 0x200000) != 0) {
    pNVar10 = local_450.stack;
    local_450.maxsp = local_450.stack + 0xfc;
    local_450.t = (J->fold).ins.field_1.t.irt & IRT_TYPE;
    local_450.mode = 0;
    if ((J->fold).ins.field_1.o != '\\') {
      local_450.mode = (IRRef)(J->fold).ins.field_0.op2;
    }
    local_450.J = J;
    local_450.sp = pNVar10;
    iVar5 = narrow_conv_backprop(&local_450,(uint)(J->fold).ins.field_0.op1,0);
    pNVar3 = local_450.sp;
    TVar8 = 0;
    if (iVar5 < 2) {
      sVar4 = 0xc80;
      if (-1 < (char)(J->fold).ins.field_1.t.irt) {
        sVar4 = 0;
      }
      uVar2 = *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2);
      pIVar12 = pNVar10;
LAB_0011b749:
      pNVar11 = pNVar10 + 1;
      TVar8 = local_450.stack[0];
      if (pNVar10 < pNVar3) {
        IVar7 = *pNVar10;
        if (IVar7 < 0x10000) {
          *pIVar12 = IVar7;
LAB_0011b7e4:
          pNVar10 = pNVar11;
          pIVar12 = pIVar12 + 1;
          goto LAB_0011b749;
        }
        uVar6 = IVar7 >> 0x10;
        if (uVar6 != 2) {
          if (uVar6 == 3) {
            if (local_450.t == IRT_I64) {
              IVar7 = lj_ir_kint64(J,(long)(int)*pNVar11);
            }
            else {
              IVar7 = lj_ir_kint(J,*pNVar11);
            }
            pNVar11 = pNVar10 + 2;
          }
          else {
            IVar9 = (IRRef1)IVar7;
            if (uVar6 != 1) {
              pIVar1 = pIVar12 + -1;
              local_470 = local_450.mode;
              if ((local_450.mode & 0xf000) == 0x2000) {
                if (((pNVar11 == pNVar3) && (-1 < (short)*pIVar1)) &&
                   (-1 < (int)((J->cur).ir[*pIVar1 & 0x7fff].field_1.op12 + 0x40000000))) {
                  sVar4 = 0;
                }
                else {
                  local_470 = local_450.mode | 0x1000;
                }
              }
              (J->fold).ins.field_0.ot = (short)(IVar7 >> 0x10) + sVar4;
              auVar13._8_8_ = 0;
              auVar13._0_8_ = *(ulong *)(pIVar12 + -2);
              auVar13 = pshuflw(auVar13,auVar13,0xe8);
              (J->fold).ins.field_1.op12 = auVar13._0_4_;
              TVar8 = lj_opt_fold(J);
              pIVar12[-2] = TVar8;
              pNVar10 = pNVar11;
              pIVar12 = pIVar1;
              if (IVar9 != 0) {
                uVar6 = J->bpropslot;
                J->bpropslot = uVar6 + 1 & 0xf;
                J->bpropcache[uVar6].key = IVar9;
                J->bpropcache[uVar6].val = (IRRef1)TVar8;
                J->bpropcache[uVar6].mode = local_470;
              }
              goto LAB_0011b749;
            }
            (J->fold).ins.field_0.op1 = IVar9;
            *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = uVar2;
            IVar7 = lj_ir_emit(J);
          }
          *pIVar12 = IVar7;
          goto LAB_0011b7e4;
        }
        (J->fold).ins.field_0.op1 = (short)pIVar12[-1];
        *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5b150ab3;
        IVar7 = lj_opt_fold(J);
        pIVar12[-1] = IVar7;
        pNVar10 = pNVar11;
        goto LAB_0011b749;
      }
    }
  }
  return TVar8;
}

Assistant:

TRef LJ_FASTCALL lj_opt_narrow_convert(jit_State *J)
{
  if ((J->flags & JIT_F_OPT_NARROW)) {
    NarrowConv nc;
    nc.J = J;
    nc.sp = nc.stack;
    nc.maxsp = &nc.stack[NARROW_MAX_STACK-4];
    nc.t = irt_type(fins->t);
    if (fins->o == IR_TOBIT) {
      nc.mode = IRCONV_TOBIT;  /* Used only in the backpropagation cache. */
    } else {
      nc.mode = fins->op2;
    }
    if (narrow_conv_backprop(&nc, fins->op1, 0) <= 1)
      return narrow_conv_emit(J, &nc);
  }
  return NEXTFOLD;
}